

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

size_t Curl_is_absolute_url(char *url,char *buf,size_t buflen,_Bool guess_scheme)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (buf != (char *)0x0) {
    *buf = '\0';
  }
  uVar3 = 0;
  if ((byte)((*url & 0xdfU) + 0xbf) < 0x1a) {
    uVar3 = 1;
    do {
      bVar1 = url[uVar3];
      if ((bVar1 == 0) ||
         (((9 < (byte)(bVar1 - 0x30) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
          ((0x2e < bVar1 || ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0))))))
      goto LAB_007073c5;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x28);
    uVar3 = 0x28;
  }
LAB_007073c5:
  if (((int)uVar3 == 0) || (uVar3 = uVar3 & 0xffffffff, url[uVar3] != ':')) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    if (url[uVar3 + 1] == '/' || !guess_scheme) {
      sVar4 = uVar3;
    }
    if ((buf != (char *)0x0) && (url[uVar3 + 1] == '/' || !guess_scheme)) {
      buf[uVar3] = '\0';
      uVar5 = uVar3;
      do {
        cVar2 = Curl_raw_tolower(url[uVar5 - 1]);
        buf[uVar5 - 1] = cVar2;
        uVar5 = uVar5 - 1;
        sVar4 = uVar3;
      } while (uVar5 != 0);
    }
  }
  return sVar4;
}

Assistant:

size_t Curl_is_absolute_url(const char *url, char *buf, size_t buflen,
                            bool guess_scheme)
{
  int i = 0;
  DEBUGASSERT(!buf || (buflen > MAX_SCHEME_LEN));
  (void)buflen; /* only used in debug-builds */
  if(buf)
    buf[0] = 0; /* always leave a defined value in buf */
#ifdef _WIN32
  if(guess_scheme && STARTS_WITH_DRIVE_PREFIX(url))
    return 0;
#endif
  if(ISALPHA(url[0]))
    for(i = 1; i < MAX_SCHEME_LEN; ++i) {
      char s = url[i];
      if(s && (ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') )) {
        /* RFC 3986 3.1 explains:
           scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
        */
      }
      else {
        break;
      }
    }
  if(i && (url[i] == ':') && ((url[i + 1] == '/') || !guess_scheme)) {
    /* If this does not guess scheme, the scheme always ends with the colon so
       that this also detects data: URLs etc. In guessing mode, data: could
       be the host name "data" with a specified port number. */

    /* the length of the scheme is the name part only */
    size_t len = i;
    if(buf) {
      buf[i] = 0;
      while(i--) {
        buf[i] = Curl_raw_tolower(url[i]);
      }
    }
    return len;
  }
  return 0;
}